

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvisci.cpp
# Opt level: O2

void UConverter_toUnicode_ISCII_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  long lVar1;
  uint16_t (*pauVar2) [2];
  byte bVar3;
  char cVar4;
  undefined4 uVar5;
  UConverter *pUVar6;
  byte *pbVar7;
  UChar *pUVar8;
  ushort *puVar9;
  int *piVar10;
  uint uVar11;
  UChar *pUVar12;
  UChar *pUVar13;
  UErrorCode UVar14;
  UChar UVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  uint32_t uVar19;
  int32_t *piVar20;
  UConverter *pUVar21;
  short sVar22;
  ushort uVar23;
  UChar UVar24;
  int32_t iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  byte *pbVar30;
  uint uVar31;
  int iVar32;
  byte *pbVar33;
  long lVar34;
  
  pUVar6 = args->converter;
  if (pUVar6 == (UConverter *)0x0) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  pbVar7 = (byte *)args->sourceLimit;
  pUVar8 = args->targetLimit;
  pbVar33 = (byte *)args->source;
  pUVar12 = args->target;
  puVar9 = (ushort *)pUVar6->extraInfo;
  UVar14 = *err;
  uVar31 = (uint)pbVar33;
  uVar16 = ~uVar31;
  iVar17 = -uVar31;
  do {
    lVar34 = 0;
    while( true ) {
      pbVar30 = pbVar33 + lVar34;
      pUVar21 = pUVar6;
      if ((U_ZERO_ERROR < UVar14) || (pbVar7 <= pbVar30)) goto LAB_002aeaff;
      if (pUVar8 <= pUVar12) {
        *err = U_BUFFER_OVERFLOW_ERROR;
        goto LAB_002aeb03;
      }
      bVar3 = *pbVar30;
      uVar29 = (ulong)bVar3;
      uVar23 = *puVar9;
      if (uVar23 != 0xef) break;
      if ((byte)(bVar3 + 0xbe) < 10) {
        puVar9[4] = (ushort)((int)lookupTable[bVar3 & 0xf] << 7);
        uVar18 = (uint)lookupTable[bVar3 & 0xf][1];
LAB_002adee1:
        *(uint *)(puVar9 + 8) = uVar18;
      }
      else {
        if (bVar3 == 0x40) {
          puVar9[4] = puVar9[2];
          uVar18 = *(uint *)(puVar9 + 10);
          goto LAB_002adee1;
        }
        if (0x1e < (byte)(bVar3 - 0x21)) {
          *err = U_ILLEGAL_CHAR_FOUND;
          *puVar9 = 0xfffe;
          goto LAB_002aeae5;
        }
      }
      *puVar9 = 0xfffe;
      lVar34 = lVar34 + 1;
    }
    iVar32 = (int)pbVar33;
    iVar28 = (int)lVar34;
    if (uVar23 == 0xd9) {
      if (*(int *)(puVar9 + 0x16) != 0) {
        *pUVar12 = (UChar)*(int *)(puVar9 + 0x16);
        piVar20 = args->offsets;
        if (piVar20 != (int32_t *)0x0) {
          args->offsets = piVar20 + 1;
          *piVar20 = (iVar32 - uVar31) + iVar28;
        }
        pUVar12 = pUVar12 + 1;
        puVar9[0x16] = 0;
        puVar9[0x17] = 0;
      }
      UVar24 = L'\x200d';
      if (bVar3 == 0xe8) {
        UVar24 = L' ';
      }
      if (pUVar12 < pUVar8) {
        *pUVar12 = UVar24;
        pUVar12 = pUVar12 + 1;
        piVar20 = args->offsets;
        if (piVar20 != (int32_t *)0x0) {
          args->offsets = piVar20 + 1;
          *piVar20 = ~uVar31 + iVar28 + iVar32;
        }
      }
      else {
        cVar4 = pUVar6->UCharErrorBufferLength;
        pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
        pUVar6->UCharErrorBuffer[cVar4] = UVar24;
        *err = U_BUFFER_OVERFLOW_ERROR;
        UVar14 = U_BUFFER_OVERFLOW_ERROR;
      }
      *puVar9 = 0xfffe;
      uVar23 = 0xfffe;
LAB_002ae08b:
      switch(bVar3) {
      case 0xe8:
        if (uVar23 == 0xe8) {
          uVar18 = 0x200c;
LAB_002ae19f:
          uVar29 = 0xfffe;
        }
        else {
          uVar18 = 0x94d;
          if ((char)puVar9[8] == '\0') {
            uVar18 = 0xffff;
          }
          uVar29 = 0xe8;
        }
        break;
      case 0xe9:
        if (uVar23 == 0xe8) {
          uVar18 = 0x200d;
          goto LAB_002ae19f;
        }
        uVar5 = *(undefined4 *)(puVar9 + 4);
        if (uVar23 == 0xc0 && (short)uVar5 == 0x100) {
          pUVar13 = pUVar12;
          if (*(int *)(puVar9 + 0x16) != 0) {
            UVar24 = (UChar)*(int *)(puVar9 + 0x16);
            if (pUVar12 < pUVar8) {
              *pUVar12 = UVar24;
              pUVar12 = pUVar12 + 1;
              piVar20 = args->offsets;
              if (piVar20 != (int32_t *)0x0) {
                args->offsets = piVar20 + 1;
                *piVar20 = iVar17 + iVar32 + iVar28;
              }
            }
            else {
              cVar4 = pUVar6->UCharErrorBufferLength;
              pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
              pUVar6->UCharErrorBuffer[cVar4] = UVar24;
              *err = U_BUFFER_OVERFLOW_ERROR;
              UVar14 = U_BUFFER_OVERFLOW_ERROR;
            }
            puVar9[0x16] = 0;
            puVar9[0x17] = 0;
            pUVar13 = pUVar12;
          }
          if (pUVar13 < pUVar8) {
            *pUVar13 = L'ੜ';
            piVar10 = args->offsets;
            if (piVar10 != (int *)0x0) {
              args->offsets = piVar10 + 1;
              *piVar10 = uVar16 + iVar32 + iVar28;
            }
            pUVar12 = pUVar13 + 1;
            if (U_ZERO_ERROR < UVar14) goto LAB_002ae8c2;
            if (pUVar12 < pUVar8) {
              pUVar13[1] = L'੍';
              piVar10 = args->offsets;
              if (piVar10 != (int *)0x0) {
                args->offsets = piVar10 + 1;
                *piVar10 = uVar16 + iVar32 + iVar28;
              }
              pUVar12 = pUVar13 + 2;
              if (U_ZERO_ERROR < UVar14) goto LAB_002ae999;
              if (pUVar12 < pUVar8) {
                pUVar13[2] = L'ਹ';
                pUVar12 = pUVar13 + 3;
                piVar20 = args->offsets;
                if (piVar20 != (int32_t *)0x0) {
                  args->offsets = piVar20 + 1;
                  *piVar20 = uVar16 + iVar32 + iVar28;
                }
              }
              else {
                cVar4 = pUVar6->UCharErrorBufferLength;
                pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
                pUVar6->UCharErrorBuffer[cVar4] = L'ਹ';
                *err = U_BUFFER_OVERFLOW_ERROR;
                UVar14 = U_BUFFER_OVERFLOW_ERROR;
              }
            }
            else {
              cVar4 = pUVar6->UCharErrorBufferLength;
              pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
              pUVar6->UCharErrorBuffer[cVar4] = L'੍';
              *err = U_BUFFER_OVERFLOW_ERROR;
              UVar14 = U_BUFFER_OVERFLOW_ERROR;
LAB_002ae999:
              cVar4 = pUVar6->UCharErrorBufferLength;
              pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
              pUVar6->UCharErrorBuffer[cVar4] = L'ਹ';
            }
          }
          else {
            cVar4 = pUVar6->UCharErrorBufferLength;
            pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
            pUVar6->UCharErrorBuffer[cVar4] = L'ੜ';
            *err = U_BUFFER_OVERFLOW_ERROR;
            UVar14 = U_BUFFER_OVERFLOW_ERROR;
            pUVar12 = pUVar13;
LAB_002ae8c2:
            cVar4 = pUVar6->UCharErrorBufferLength;
            pUVar6->UCharErrorBuffer[cVar4] = L'੍';
            pUVar6->UCharErrorBufferLength = cVar4 + '\x02';
            pUVar6->UCharErrorBuffer[(char)(cVar4 + '\x01')] = L'ਹ';
          }
          pUVar6->toUnicodeStatus = 0xffff;
          *puVar9 = 0xfffe;
          goto LAB_002ae7df;
        }
        lVar27 = 1;
        do {
          if (lVar27 == 0x10) goto switchD_002ae0a5_caseD_eb;
          lVar1 = lVar27 + 1;
          pauVar2 = nuktaSpecialCases + lVar27;
          lVar27 = lVar1;
        } while ((*pauVar2)[0] != (uVar23 & 0xff));
        UVar24 = toUnicodeTable[lVar1 * 2 + 0xff];
        uVar18 = (uint)(ushort)UVar24;
        if ((*(uint *)(puVar9 + 8) & (uint)""[(byte)UVar24]) == 0) goto switchD_002ae0a5_caseD_eb;
        *puVar9 = 0xfffe;
        pUVar6->toUnicodeStatus = 0xffff;
        if ((short)uVar5 == 0x100) {
          if (*(int *)(puVar9 + 0x16) != 0) {
            UVar15 = (UChar)*(int *)(puVar9 + 0x16);
            if (pUVar12 < pUVar8) {
              *pUVar12 = UVar15;
              pUVar12 = pUVar12 + 1;
              piVar20 = args->offsets;
              if (piVar20 != (int32_t *)0x0) {
                args->offsets = piVar20 + 1;
                *piVar20 = iVar17 + iVar32 + iVar28;
              }
            }
            else {
              cVar4 = pUVar6->UCharErrorBufferLength;
              pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
              pUVar6->UCharErrorBuffer[cVar4] = UVar15;
              *err = U_BUFFER_OVERFLOW_ERROR;
              UVar14 = U_BUFFER_OVERFLOW_ERROR;
            }
            puVar9[0x16] = 0;
            puVar9[0x17] = 0;
          }
          if (((0xa0 < (ushort)UVar24) && (1 < (ushort)UVar24 - 0x964)) &&
             (1 < (ushort)UVar24 - 0x200c)) {
            UVar24 = UVar24 + L'Ā';
          }
          if (pUVar8 <= pUVar12) {
            cVar4 = pUVar6->UCharErrorBufferLength;
            pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
            pUVar6->UCharErrorBuffer[cVar4] = UVar24;
            goto LAB_002ae117;
          }
          *pUVar12 = UVar24;
          pUVar12 = pUVar12 + 1;
          piVar20 = args->offsets;
          if (piVar20 != (int32_t *)0x0) {
            iVar25 = uVar16 + iVar32 + iVar28;
            goto LAB_002adfd5;
          }
          goto LAB_002ae7df;
        }
        goto LAB_002ae72b;
      case 0xea:
        uVar18 = 0x965;
        if (uVar23 != 0xea) {
          uVar18 = 0x964;
          if ((puVar9[8] & 0x80) == 0) {
            uVar18 = 0xffff;
          }
          uVar29 = 0xea;
          break;
        }
LAB_002ae214:
        *puVar9 = 0xfffe;
        goto LAB_002ae738;
      case 0xeb:
      case 0xec:
      case 0xed:
      case 0xee:
switchD_002ae0a5_caseD_eb:
        uVar18 = (uint)toUnicodeTable[uVar29];
        if ((0xa0 < bVar3) &&
           ((*(uint *)(puVar9 + 8) & (uint)""[toUnicodeTable[uVar29] & 0x7f]) == 0)) {
          if (bVar3 != 0xd0) {
            uVar18 = 0xffff;
          }
          if (puVar9[4] != 0x300) {
            uVar18 = 0xffff;
          }
        }
        break;
      case 0xef:
      case 0xf0:
switchD_002ae0a5_caseD_ef:
        *puVar9 = (ushort)bVar3;
        uVar19 = pUVar6->toUnicodeStatus;
        if (uVar19 == 0xffff) goto LAB_002ae7df;
        if (*(int *)(puVar9 + 0x16) != 0) {
          UVar24 = (UChar)*(int *)(puVar9 + 0x16);
          if (pUVar12 < pUVar8) {
            *pUVar12 = UVar24;
            pUVar12 = pUVar12 + 1;
            piVar20 = args->offsets;
            if (piVar20 != (int32_t *)0x0) {
              args->offsets = piVar20 + 1;
              *piVar20 = iVar17 + iVar32 + iVar28;
            }
          }
          else {
            cVar4 = pUVar6->UCharErrorBufferLength;
            pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
            pUVar6->UCharErrorBuffer[cVar4] = UVar24;
            *err = U_BUFFER_OVERFLOW_ERROR;
            UVar14 = U_BUFFER_OVERFLOW_ERROR;
          }
          puVar9[0x16] = 0;
          puVar9[0x17] = 0;
          uVar19 = pUVar6->toUnicodeStatus;
        }
        if (((0xa0 < (int)uVar19) && (1 < uVar19 - 0x964)) && (1 < uVar19 - 0x200c)) {
          uVar19 = uVar19 + puVar9[4];
        }
        if (pUVar12 < pUVar8) {
          *pUVar12 = (UChar)uVar19;
          pUVar12 = pUVar12 + 1;
          piVar20 = args->offsets;
          if (piVar20 != (int32_t *)0x0) {
            args->offsets = piVar20 + 1;
            *piVar20 = uVar16 + iVar32 + iVar28;
          }
        }
        else {
          cVar4 = pUVar6->UCharErrorBufferLength;
          pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
          pUVar6->UCharErrorBuffer[cVar4] = (UChar)uVar19;
          *err = U_BUFFER_OVERFLOW_ERROR;
          UVar14 = U_BUFFER_OVERFLOW_ERROR;
        }
        goto LAB_002ae7d8;
      default:
        if ((bVar3 == 10) || (bVar3 == 0xd)) {
          *(undefined1 *)((long)puVar9 + 0x19) = 1;
          uVar18 = (uint)toUnicodeTable[uVar29];
        }
        else {
          if (bVar3 != 0xe0) {
            if (bVar3 == 0xd9) goto switchD_002ae0a5_caseD_ef;
            goto switchD_002ae0a5_caseD_eb;
          }
          uVar18 = 0x904;
          if ((char)*(uint *)(puVar9 + 8) < '\0' && (char)uVar23 == -0x5c) goto LAB_002ae214;
          uVar18 = 0x946;
          if ((*(uint *)(puVar9 + 8) & 0x87) == 0) {
            uVar18 = 0xffff;
          }
          uVar29 = 0xe0;
        }
      }
      *puVar9 = (ushort)uVar29;
      if (pUVar6->toUnicodeStatus != 0xffff) {
        uVar11 = (uint)puVar9[4];
        iVar26 = *(int *)(puVar9 + 0x16);
        if (iVar26 - 0xa00U < 0x50 && uVar11 == 0x100) {
          if (((pUVar6->toUnicodeStatus == 0x94d) && ((""[iVar26 - 0xa00U] & 1) != 0)) &&
             (uVar18 + 0x100 == iVar26)) {
            iVar28 = (-2 - uVar31) + iVar32 + iVar28;
            if (pUVar12 < pUVar8) {
              *pUVar12 = L'ੱ';
              pUVar12 = pUVar12 + 1;
              piVar20 = args->offsets;
              if (piVar20 != (int32_t *)0x0) {
                args->offsets = piVar20 + 1;
                *piVar20 = iVar28;
                iVar26 = *(int *)(puVar9 + 0x16);
              }
            }
            else {
              cVar4 = pUVar6->UCharErrorBufferLength;
              pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
              pUVar6->UCharErrorBuffer[cVar4] = L'ੱ';
              *err = U_BUFFER_OVERFLOW_ERROR;
              UVar14 = U_BUFFER_OVERFLOW_ERROR;
            }
            if (pUVar12 < pUVar8) {
              *pUVar12 = (UChar)iVar26;
              pUVar12 = pUVar12 + 1;
              piVar20 = args->offsets;
              if (piVar20 != (int32_t *)0x0) {
                args->offsets = piVar20 + 1;
                *piVar20 = iVar28;
              }
            }
            else {
              cVar4 = pUVar6->UCharErrorBufferLength;
              pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
              pUVar6->UCharErrorBuffer[cVar4] = (UChar)iVar26;
              *err = U_BUFFER_OVERFLOW_ERROR;
              UVar14 = U_BUFFER_OVERFLOW_ERROR;
            }
            puVar9[0x16] = 0;
            puVar9[0x17] = 0;
LAB_002ae7d8:
            pUVar6->toUnicodeStatus = 0xffff;
            goto LAB_002ae7df;
          }
LAB_002ae55b:
          if (pUVar12 < pUVar8) {
            *pUVar12 = (UChar)iVar26;
            pUVar12 = pUVar12 + 1;
            piVar20 = args->offsets;
            if (piVar20 != (int32_t *)0x0) {
              args->offsets = piVar20 + 1;
              *piVar20 = iVar17 + iVar32 + iVar28;
            }
          }
          else {
            cVar4 = pUVar6->UCharErrorBufferLength;
            pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
            pUVar6->UCharErrorBuffer[cVar4] = (UChar)iVar26;
            *err = U_BUFFER_OVERFLOW_ERROR;
            UVar14 = U_BUFFER_OVERFLOW_ERROR;
          }
          puVar9[0x16] = 0;
          puVar9[0x17] = 0;
        }
        else if (iVar26 != 0) goto LAB_002ae55b;
        if ((uVar11 == 0x100) && (uVar18 == 0x902)) {
          uVar19 = pUVar6->toUnicodeStatus;
          if ((uVar19 - 0x950 < 0xffffffb0) || (""[uVar19 - 0x900] < 2)) {
LAB_002ae6a1:
            if ((0xa0 < (int)uVar19) && ((1 < uVar19 - 0x964 && (1 < uVar19 - 0x200c)))) {
              uVar19 = uVar19 + uVar11;
              pUVar6->toUnicodeStatus = uVar19;
            }
            if (pUVar12 < pUVar8) {
              *pUVar12 = (UChar)uVar19;
              pUVar12 = pUVar12 + 1;
              piVar20 = args->offsets;
              if (piVar20 != (int32_t *)0x0) {
                args->offsets = piVar20 + 1;
                *piVar20 = uVar16 + iVar32 + iVar28;
              }
            }
            else {
              cVar4 = pUVar6->UCharErrorBufferLength;
              pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
              pUVar6->UCharErrorBuffer[cVar4] = (UChar)uVar19;
              *err = U_BUFFER_OVERFLOW_ERROR;
              UVar14 = U_BUFFER_OVERFLOW_ERROR;
            }
          }
          else {
            UVar24 = (short)uVar19 + L'Ā';
            if (pUVar12 < pUVar8) {
              *pUVar12 = UVar24;
              pUVar12 = pUVar12 + 1;
              piVar20 = args->offsets;
              uVar18 = 0x970;
              if (piVar20 != (int32_t *)0x0) {
                args->offsets = piVar20 + 1;
                *piVar20 = uVar16 + iVar32 + iVar28;
                uVar18 = 0x970;
              }
            }
            else {
              cVar4 = pUVar6->UCharErrorBufferLength;
              pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
              pUVar6->UCharErrorBuffer[cVar4] = UVar24;
              *err = U_BUFFER_OVERFLOW_ERROR;
              uVar18 = 0x970;
              UVar14 = U_BUFFER_OVERFLOW_ERROR;
            }
          }
        }
        else {
          uVar19 = pUVar6->toUnicodeStatus;
          if (((uVar11 != 0x100) || ((uVar18 != 0x94d || (uVar19 - 0x950 < 0xffffffb0)))) ||
             ((""[uVar19 - 0x900] & 1) == 0)) goto LAB_002ae6a1;
          *(uint32_t *)(puVar9 + 0x16) = uVar19 + 0x100;
          uVar18 = 0x94d;
        }
        pUVar6->toUnicodeStatus = 0xffff;
      }
LAB_002ae72b:
      if (uVar18 == 0xffff) goto LAB_002aeac7;
LAB_002ae738:
      pUVar6->toUnicodeStatus = uVar18;
      if (*(char *)((long)puVar9 + 0x19) == '\x01') {
        puVar9[4] = puVar9[2];
        *(undefined4 *)(puVar9 + 8) = *(undefined4 *)(puVar9 + 10);
        *(undefined1 *)((long)puVar9 + 0x19) = 0;
      }
    }
    else {
      if (uVar23 != 0xf0) goto LAB_002ae08b;
      if (0x4d < (byte)(bVar3 + 0x5f)) {
        *puVar9 = 0xfffe;
        *err = U_ILLEGAL_CHAR_FOUND;
        goto LAB_002aeae5;
      }
      if ((bVar3 != 0xbf) && (bVar3 != 0xb8)) {
LAB_002aeac7:
        *err = U_INVALID_CHAR_FOUND;
LAB_002aeae5:
        pUVar6->toUBytes[0] = bVar3;
        pUVar21 = args->converter;
        pUVar21->toULength = '\x01';
        UVar14 = *err;
        pbVar30 = pbVar33 + lVar34 + 1;
LAB_002aeaff:
        pbVar33 = pbVar30;
        if (((UVar14 < U_ILLEGAL_ARGUMENT_ERROR) && (args->flush != '\0')) && (pbVar30 == pbVar7)) {
          uVar16 = *puVar9 - 0xd9;
          if ((uVar16 < 0x18) && ((0xc00001U >> (uVar16 & 0x1f) & 1) != 0)) {
            pUVar21->toUBytes[0] = (uint8_t)*puVar9;
            pUVar21->toULength = '\x01';
            *puVar9 = 0xfffe;
          }
          else {
            pUVar21->toULength = '\0';
          }
          uVar19 = pUVar6->toUnicodeStatus;
          if (uVar19 != 0xffff) {
            if (((0xa0 < (int)uVar19) && (1 < uVar19 - 0x964)) && (1 < uVar19 - 0x200c)) {
              uVar19 = uVar19 + puVar9[4];
            }
            if (pUVar12 < args->targetLimit) {
              *pUVar12 = (UChar)uVar19;
              pUVar12 = pUVar12 + 1;
              piVar10 = args->offsets;
              if (piVar10 != (int *)0x0) {
                args->offsets = piVar10 + 1;
                *piVar10 = (int)pbVar7 + ~*(uint *)&args->source;
              }
            }
            else {
              pUVar21 = args->converter;
              cVar4 = pUVar21->UCharErrorBufferLength;
              pUVar21->UCharErrorBufferLength = cVar4 + '\x01';
              pUVar21->UCharErrorBuffer[cVar4] = (UChar)uVar19;
              *err = U_BUFFER_OVERFLOW_ERROR;
            }
            pUVar6->toUnicodeStatus = 0xffff;
          }
        }
LAB_002aeb03:
        args->target = pUVar12;
        args->source = (char *)pbVar33;
        return;
      }
      sVar22 = 0x952;
      if (bVar3 == 0xbf) {
        sVar22 = 0x970;
      }
      pbVar30 = (uint8_t *)0x3448f2;
      if (bVar3 == 0xbf) {
        pbVar30 = (uint8_t *)0x344910;
      }
      if ((*(uint *)(puVar9 + 8) & (uint)*pbVar30) == 0) goto LAB_002aeac7;
      *puVar9 = 0xfffe;
      if (*(int *)(puVar9 + 0x16) != 0) {
        *pUVar12 = (UChar)*(int *)(puVar9 + 0x16);
        piVar20 = args->offsets;
        if (piVar20 != (int32_t *)0x0) {
          args->offsets = piVar20 + 1;
          *piVar20 = (iVar32 - uVar31) + iVar28;
        }
        pUVar12 = pUVar12 + 1;
        puVar9[0x16] = 0;
        puVar9[0x17] = 0;
      }
      uVar23 = puVar9[4];
      if (pUVar12 < pUVar8) {
        *pUVar12 = sVar22 + uVar23;
        pUVar12 = pUVar12 + 1;
        piVar20 = args->offsets;
        if (piVar20 != (int32_t *)0x0) {
          iVar25 = ~uVar31 + iVar28 + iVar32;
LAB_002adfd5:
          args->offsets = piVar20 + 1;
          *piVar20 = iVar25;
        }
      }
      else {
        cVar4 = pUVar6->UCharErrorBufferLength;
        pUVar6->UCharErrorBufferLength = cVar4 + '\x01';
        pUVar6->UCharErrorBuffer[cVar4] = sVar22 + uVar23;
LAB_002ae117:
        *err = U_BUFFER_OVERFLOW_ERROR;
        UVar14 = U_BUFFER_OVERFLOW_ERROR;
      }
    }
LAB_002ae7df:
    pbVar33 = pbVar33 + lVar34 + 1;
  } while( true );
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISCII_OFFSETS_LOGIC(UConverterToUnicodeArgs *args, UErrorCode* err) {
    const char *source = ( char *) args->source;
    UChar *target = args->target;
    const char *sourceLimit = args->sourceLimit;
    const UChar* targetLimit = args->targetLimit;
    uint32_t targetUniChar = 0x0000;
    uint8_t sourceChar = 0x0000;
    UConverterDataISCII* data;
    UChar32* toUnicodeStatus=NULL;
    UChar32 tempTargetUniChar = 0x0000;
    UChar* contextCharToUnicode= NULL;
    UBool found;
    int i; 
    int offset = 0;

    if ((args->converter == NULL) || (target < args->target) || (source < args->source)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    data = (UConverterDataISCII*)(args->converter->extraInfo);
    contextCharToUnicode = &data->contextCharToUnicode; /* contains previous ISCII codepoint visited */
    toUnicodeStatus = (UChar32*)&args->converter->toUnicodeStatus;/* contains the mapping to Unicode of the above codepoint*/

    while (U_SUCCESS(*err) && source<sourceLimit) {

        targetUniChar = missingCharMarker;

        if (target < targetLimit) {
            sourceChar = (unsigned char)*(source)++;

            /* look at the post-context preform special processing */
            if (*contextCharToUnicode==ATR) {

                /* If we have ATR in *contextCharToUnicode then we need to change our
                 * state to the Indic Script specified by sourceChar
                 */

                /* check if the sourceChar is supported script range*/
                if ((uint8_t)(PNJ-sourceChar)<=PNJ-DEV) {
                    data->currentDeltaToUnicode = (uint16_t)(lookupTable[sourceChar & 0x0F][0] * DELTA);
                    data->currentMaskToUnicode = (MaskEnum)lookupTable[sourceChar & 0x0F][1];
                } else if (sourceChar==DEF) {
                    /* switch back to default */
                    data->currentDeltaToUnicode = data->defDeltaToUnicode;
                    data->currentMaskToUnicode = data->defMaskToUnicode;
                } else {
                    if ((sourceChar >= 0x21 && sourceChar <= 0x3F)) {
                        /* these are display codes consume and continue */
                    } else {
                        *err =U_ILLEGAL_CHAR_FOUND;
                        /* reset */
                        *contextCharToUnicode=NO_CHAR_MARKER;
                        goto CALLBACK;
                    }
                }

                /* reset */
                *contextCharToUnicode=NO_CHAR_MARKER;

                continue;

            } else if (*contextCharToUnicode==EXT) {
                /* check if sourceChar is in 0xA1-0xEE range */
                if ((uint8_t) (EXT_RANGE_END - sourceChar) <= (EXT_RANGE_END - EXT_RANGE_BEGIN)) {
                    /* We currently support only Anudatta and Devanagari abbreviation sign */
                    if (sourceChar==0xBF || sourceChar == 0xB8) {
                        targetUniChar = (sourceChar==0xBF) ? DEV_ABBR_SIGN : DEV_ANUDATTA;
                        
                        /* find out if the mapping is valid in this state */
                        if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                            *contextCharToUnicode= NO_CHAR_MARKER;

                            /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                            if (data->prevToUnicodeStatus) {
                                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                                data->prevToUnicodeStatus = 0x0000;
                            }
                            /* write to target */
                            WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);

                            continue;
                        }
                    }
                    /* byte unit is unassigned */
                    targetUniChar = missingCharMarker;
                    *err= U_INVALID_CHAR_FOUND;
                } else {
                    /* only 0xA1 - 0xEE are legal after EXT char */
                    *contextCharToUnicode= NO_CHAR_MARKER;
                    *err = U_ILLEGAL_CHAR_FOUND;
                }
                goto CALLBACK;
            } else if (*contextCharToUnicode==ISCII_INV) {
                if (sourceChar==ISCII_HALANT) {
                    targetUniChar = 0x0020; /* replace with space accoding to Indic FAQ */
                } else {
                    targetUniChar = ZWJ;
                }

                /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                if (data->prevToUnicodeStatus) {
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                    data->prevToUnicodeStatus = 0x0000;
                }
                /* write to target */
                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);
                /* reset */
                *contextCharToUnicode=NO_CHAR_MARKER;
            }

            /* look at the pre-context and perform special processing */
            switch (sourceChar) {
            case ISCII_INV:
            case EXT:
            case ATR:
                *contextCharToUnicode = (UChar)sourceChar;

                if (*toUnicodeStatus != missingCharMarker) {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,data->currentDeltaToUnicode,err);
                    *toUnicodeStatus = missingCharMarker;
                }
                continue;
            case ISCII_DANDA:
                /* handle double danda*/
                if (*contextCharToUnicode== ISCII_DANDA) {
                    targetUniChar = DOUBLE_DANDA;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                    *toUnicodeStatus = missingCharMarker;
                } else {
                    GET_MAPPING(sourceChar,targetUniChar,data);
                    *contextCharToUnicode = sourceChar;
                }
                break;
            case ISCII_HALANT:
                /* handle explicit halant */
                if (*contextCharToUnicode == ISCII_HALANT) {
                    targetUniChar = ZWNJ;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                } else {
                    GET_MAPPING(sourceChar,targetUniChar,data);
                    *contextCharToUnicode = sourceChar;
                }
                break;
            case 0x0A:
            case 0x0D:
                data->resetToDefaultToUnicode = TRUE;
                GET_MAPPING(sourceChar,targetUniChar,data)
                ;
                *contextCharToUnicode = sourceChar;
                break;

            case ISCII_VOWEL_SIGN_E:
                i=1;
                found=FALSE;
                for (; i<vowelSignESpecialCases[0][0]; i++) {
                    U_ASSERT(i<UPRV_LENGTHOF(vowelSignESpecialCases));
                    if (vowelSignESpecialCases[i][0]==(uint8_t)*contextCharToUnicode) {
                        targetUniChar=vowelSignESpecialCases[i][1];
                        found=TRUE;
                        break;
                    }
                }
                if (found) {
                    /* find out if the mapping is valid in this state */
                    if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                        /*targetUniChar += data->currentDeltaToUnicode ;*/
                        *contextCharToUnicode= NO_CHAR_MARKER;
                        *toUnicodeStatus = missingCharMarker;
                        break;
                    }
                }
                GET_MAPPING(sourceChar,targetUniChar,data);
                *contextCharToUnicode = sourceChar;
                break;

            case ISCII_NUKTA:
                /* handle soft halant */
                if (*contextCharToUnicode == ISCII_HALANT) {
                    targetUniChar = ZWJ;
                    /* clear the context */
                    *contextCharToUnicode = NO_CHAR_MARKER;
                    break;
                } else if (data->currentDeltaToUnicode == PNJ_DELTA && data->contextCharToUnicode == 0xc0) {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    /* We got here because ISCII_NUKTA was preceded by 0xc0 and we are converting Gurmukhi.
                     * In that case we must convert (0xc0 0xe9) to (\u0a5c\u0a4d\u0a39).
                     */
                    targetUniChar = PNJ_RRA;
                    WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                    if (U_SUCCESS(*err)) {
                        targetUniChar = PNJ_SIGN_VIRAMA;
                        WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                        if (U_SUCCESS(*err)) {
                            targetUniChar = PNJ_HA;
                            WRITE_TO_TARGET_TO_U(args, source, target, args->offsets, (source-args->source)-2, targetUniChar, 0, err);
                        } else {
                            args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_HA;
                        }
                    } else {
                        args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_SIGN_VIRAMA;
                        args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]= PNJ_HA;
                    }
                    *toUnicodeStatus = missingCharMarker;
                    data->contextCharToUnicode = NO_CHAR_MARKER;
                    continue;
                } else {
                    /* try to handle <CHAR> + ISCII_NUKTA special mappings */
                    i=1;
                    found =FALSE;
                    for (; i<nuktaSpecialCases[0][0]; i++) {
                        if (nuktaSpecialCases[i][0]==(uint8_t)
                                *contextCharToUnicode) {
                            targetUniChar=nuktaSpecialCases[i][1];
                            found =TRUE;
                            break;
                        }
                    }
                    if (found) {
                        /* find out if the mapping is valid in this state */
                        if (validityTable[(uint8_t)targetUniChar] & data->currentMaskToUnicode) {
                            /*targetUniChar += data->currentDeltaToUnicode ;*/
                            *contextCharToUnicode= NO_CHAR_MARKER;
                            *toUnicodeStatus = missingCharMarker;
                            if (data->currentDeltaToUnicode == PNJ_DELTA) {
                                /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                                if (data->prevToUnicodeStatus) {
                                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                                    data->prevToUnicodeStatus = 0x0000;
                                }
                                WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),targetUniChar,data->currentDeltaToUnicode,err);
                                continue;
                            }
                            break;
                        }
                        /* else fall through to default */
                    }
                    /* else fall through to default */
                    U_FALLTHROUGH;
                }
            default:GET_MAPPING(sourceChar,targetUniChar,data)
                ;
                *contextCharToUnicode = sourceChar;
                break;
            }

            if (*toUnicodeStatus != missingCharMarker) {
                /* Check to make sure that consonant clusters are handled correct for Gurmukhi script. */
                if (data->currentDeltaToUnicode == PNJ_DELTA && data->prevToUnicodeStatus != 0 && isPNJConsonant(data->prevToUnicodeStatus) &&
                        (*toUnicodeStatus + PNJ_DELTA) == PNJ_SIGN_VIRAMA && ((UChar32)(targetUniChar + PNJ_DELTA) == data->prevToUnicodeStatus)) {
                    /* Consonant clusters C + HALANT + C should be encoded as ADHAK + C */
                    offset = (int)(source-args->source - 3);
                    tempTargetUniChar = PNJ_ADHAK; /* This is necessary to avoid some compiler warnings. */
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,offset,tempTargetUniChar,0,err);
                    WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,offset,data->prevToUnicodeStatus,0,err);
                    data->prevToUnicodeStatus = 0x0000; /* reset the previous unicode code point */
                    *toUnicodeStatus = missingCharMarker;
                    continue;
                } else {
                    /* Write the previous toUnicodeStatus, this was delayed to handle consonant clustering for Gurmukhi script. */
                    if (data->prevToUnicodeStatus) {
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -1),data->prevToUnicodeStatus,0,err);
                        data->prevToUnicodeStatus = 0x0000;
                    }
                    /* Check to make sure that Bindi and Tippi are handled correctly for Gurmukhi script. 
                     * If 0xA2 is preceded by a codepoint in the PNJ_BINDI_TIPPI_SET then the target codepoint should be Tippi instead of Bindi.
                     */
                    if (data->currentDeltaToUnicode == PNJ_DELTA && (targetUniChar + PNJ_DELTA) == PNJ_BINDI && isPNJBindiTippi((*toUnicodeStatus + PNJ_DELTA))) {
                        targetUniChar = PNJ_TIPPI - PNJ_DELTA;
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,PNJ_DELTA,err);
                    } else if (data->currentDeltaToUnicode == PNJ_DELTA && (targetUniChar + PNJ_DELTA) == PNJ_SIGN_VIRAMA && isPNJConsonant((*toUnicodeStatus + PNJ_DELTA))) {
                        /* Store the current toUnicodeStatus code point for later handling of consonant cluster in Gurmukhi. */
                        data->prevToUnicodeStatus = *toUnicodeStatus + PNJ_DELTA;
                    } else {
                        /* write the previously mapped codepoint */
                        WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source-args->source -2),*toUnicodeStatus,data->currentDeltaToUnicode,err);
                    }
                }
                *toUnicodeStatus = missingCharMarker;
            }

            if (targetUniChar != missingCharMarker) {
                /* now save the targetUniChar for delayed write */
                *toUnicodeStatus = (UChar) targetUniChar;
                if (data->resetToDefaultToUnicode==TRUE) {
                    data->currentDeltaToUnicode = data->defDeltaToUnicode;
                    data->currentMaskToUnicode = data->defMaskToUnicode;
                    data->resetToDefaultToUnicode=FALSE;
                }
            } else {

                /* we reach here only if targetUniChar == missingCharMarker
                 * so assign codes to reason and err
                 */
                *err = U_INVALID_CHAR_FOUND;
CALLBACK:
                args->converter->toUBytes[0] = (uint8_t) sourceChar;
                args->converter->toULength = 1;
                break;
            }

        } else {
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }

    if (U_SUCCESS(*err) && args->flush && source == sourceLimit) {
        /* end of the input stream */
        UConverter *cnv = args->converter;

        if (*contextCharToUnicode==ATR || *contextCharToUnicode==EXT || *contextCharToUnicode==ISCII_INV) {
            /* set toUBytes[] */
            cnv->toUBytes[0] = (uint8_t)*contextCharToUnicode;
            cnv->toULength = 1;

            /* avoid looping on truncated sequences */
            *contextCharToUnicode = NO_CHAR_MARKER;
        } else {
            cnv->toULength = 0;
        }

        if (*toUnicodeStatus != missingCharMarker) {
            /* output a remaining target character */
            WRITE_TO_TARGET_TO_U(args,source,target,args->offsets,(source - args->source -1),*toUnicodeStatus,data->currentDeltaToUnicode,err);
            *toUnicodeStatus = missingCharMarker;
        }
    }

    args->target = target;
    args->source = source;
}